

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_tryParameters(void *opaque)

{
  COVER_dictSelection_t selection_00;
  COVER_dictSelection_t selection_01;
  ZDICT_cover_params_t parameters_00;
  COVER_dictSelection_t selection_02;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_01;
  int iVar1;
  uint uVar2;
  void *__ptr;
  BYTE *samplesBuffer;
  long *in_RDI;
  size_t tail;
  U32 *freqs;
  COVER_dictSelection_t selection;
  BYTE *dict;
  COVER_map_t activeDmers;
  size_t totalCompressedSize;
  size_t dictBufferCapacity;
  ZDICT_cover_params_t parameters;
  COVER_ctx_t *ctx;
  COVER_tryParameters_data_t *data;
  COVER_map_t *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff20;
  U32 *in_stack_ffffffffffffff28;
  undefined1 *in_stack_ffffffffffffff30;
  undefined1 *puVar3;
  undefined8 in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  BYTE *in_stack_ffffffffffffff48;
  size_t *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  BYTE *in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  void *in_stack_ffffffffffffff88;
  COVER_map_t *in_stack_ffffffffffffff90;
  U32 *freqs_00;
  COVER_ctx_t *ctx_00;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  COVER_best_t *in_stack_ffffffffffffffd0;
  long lVar4;
  
  puVar3 = &stack0xfffffffffffffed8;
  lVar4 = *in_RDI;
  memcpy(&stack0xffffffffffffffa8,in_RDI + 3,0x30);
  ctx_00 = (COVER_ctx_t *)in_RDI[2];
  freqs_00 = (U32 *)0xffffffffffffffff;
  __ptr = malloc((size_t)ctx_00);
  COVER_dictSelectionError(in_stack_fffffffffffffee0);
  samplesBuffer = (BYTE *)malloc(*(long *)(lVar4 + 0x38) << 2);
  iVar1 = COVER_map_init(in_stack_fffffffffffffed8,0);
  if (iVar1 == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Failed to allocate dmer map: out of memory\n");
      fflush(_stderr);
    }
  }
  else if ((__ptr == (void *)0x0) || (samplesBuffer == (BYTE *)0x0)) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Failed to allocate buffers: out of memory\n");
      fflush(_stderr);
    }
  }
  else {
    memcpy(samplesBuffer,*(void **)(lVar4 + 0x40),*(long *)(lVar4 + 0x38) << 2);
    parameters_01.steps = (int)in_stack_ffffffffffffffb8;
    parameters_01.nbThreads = (int)(in_stack_ffffffffffffffb8 >> 0x20);
    parameters_01.k = (int)in_stack_ffffffffffffffb0;
    parameters_01.d = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    parameters_01.splitPoint = (double)in_stack_ffffffffffffffc0;
    parameters_01._24_8_ = in_stack_ffffffffffffffc8;
    parameters_01.zParams._0_8_ = in_stack_ffffffffffffffd0;
    parameters_01._40_8_ = lVar4;
    in_stack_ffffffffffffff28 = freqs_00;
    in_stack_ffffffffffffff50 =
         (size_t *)
         COVER_buildDictionary
                   (ctx_00,freqs_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),parameters_01);
    in_stack_ffffffffffffff20 = *(undefined8 *)(lVar4 + 8);
    params._8_8_ = ctx_00;
    params._0_8_ = in_stack_ffffffffffffff28;
    params.splitPoint = (double)in_stack_ffffffffffffffa8;
    params.shrinkDict = (int)in_stack_ffffffffffffffb0;
    params.shrinkDictMaxRegression = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    params.zParams.compressionLevel = (int)in_stack_ffffffffffffffb8;
    params.zParams.notificationLevel = (int)(in_stack_ffffffffffffffb8 >> 0x20);
    params._40_8_ = in_stack_ffffffffffffffc0;
    COVER_selectDict(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                     samplesBuffer,in_stack_ffffffffffffff50,in_stack_ffffffffffffff80,
                     (size_t)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff90,params,
                     in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffd0);
    selection_01.dictSize = in_stack_ffffffffffffffb0;
    selection_01.dictContent = (BYTE *)in_stack_ffffffffffffffa8;
    selection_01.totalCompressedSize = in_stack_ffffffffffffffb8;
    in_stack_ffffffffffffff68 = in_stack_ffffffffffffff40;
    in_stack_ffffffffffffff70 = in_stack_ffffffffffffff48;
    uVar2 = COVER_dictSelectionIsError(selection_01);
    in_stack_ffffffffffffff30 = puVar3;
    if ((uVar2 != 0) && (0 < g_displayLevel)) {
      fprintf(_stderr,"Failed to select dictionary\n");
      fflush(_stderr);
      in_stack_ffffffffffffff30 = puVar3;
    }
  }
  free(__ptr);
  parameters_00._8_8_ = in_stack_ffffffffffffff70;
  parameters_00.k = (int)in_stack_ffffffffffffff68;
  parameters_00.d = (int)(in_stack_ffffffffffffff68 >> 0x20);
  parameters_00.splitPoint = (double)in_stack_ffffffffffffff20;
  parameters_00._24_8_ = in_stack_ffffffffffffff28;
  parameters_00.zParams._0_8_ = in_stack_ffffffffffffff30;
  parameters_00._40_8_ = in_stack_ffffffffffffff38;
  selection_02.dictSize = (size_t)in_stack_ffffffffffffff48;
  selection_02.dictContent = (BYTE *)in_stack_ffffffffffffff40;
  selection_02.totalCompressedSize = (size_t)in_stack_ffffffffffffff50;
  COVER_best_finish(in_stack_ffffffffffffffd0,parameters_00,selection_02);
  free(in_RDI);
  COVER_map_destroy((COVER_map_t *)0x293874);
  selection_00.dictSize = (size_t)in_stack_ffffffffffffff70;
  selection_00.dictContent = (BYTE *)in_stack_ffffffffffffff68;
  selection_00.totalCompressedSize = in_stack_ffffffffffffffc0;
  COVER_dictSelectionFree(selection_00);
  free(samplesBuffer);
  return;
}

Assistant:

static void COVER_tryParameters(void *opaque)
{
  /* Save parameters as local variables */
  COVER_tryParameters_data_t *const data = (COVER_tryParameters_data_t*)opaque;
  const COVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Allocate space for hash table, dict, and freqs */
  COVER_map_t activeDmers;
  BYTE* const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* const freqs = (U32*)malloc(ctx->suffixSize * sizeof(U32));
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    goto _cleanup;
  }
  if (!dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ctx->suffixSize * sizeof(U32));
  /* Build the dictionary */
  {
    const size_t tail = COVER_buildDictionary(ctx, freqs, &activeDmers, dict,
                                              dictBufferCapacity, parameters);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
        ctx->samples, ctx->samplesSizes, (unsigned)ctx->nbTrainSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
        totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  COVER_map_destroy(&activeDmers);
  COVER_dictSelectionFree(selection);
  free(freqs);
}